

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t __thiscall
driver::zetDebugReadRegisters
          (driver *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,uint32_t type,
          uint32_t start,uint32_t count,void *pRegisterValues)

{
  undefined4 in_stack_0000000c;
  zet_pfnDebugReadRegisters_t pfnReadRegisters;
  ze_result_t result;
  uint32_t count_local;
  uint32_t start_local;
  uint32_t type_local;
  zet_debug_session_handle_t hDebug_local;
  ze_device_thread_t thread_local;
  
  pfnReadRegisters._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c9a0 != (code *)0x0) {
    pfnReadRegisters._0_4_ =
         (*DAT_0011c9a0)(this,hDebug,thread._0_8_,thread.eu,type,start,
                         CONCAT44(in_stack_0000000c,count));
  }
  return (ze_result_t)pfnReadRegisters;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugReadRegisters(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier
        uint32_t type,                                  ///< [in] register set type
        uint32_t start,                                 ///< [in] the starting offset into the register state area; must be less
                                                        ///< than the `count` member of ::zet_debug_regset_properties_t for the
                                                        ///< type
        uint32_t count,                                 ///< [in] the number of registers to read; start+count must be less than or
                                                        ///< equal to the `count` member of ::zet_debug_regset_properties_t for the
                                                        ///< type
        void* pRegisterValues                           ///< [in,out][optional][range(0, count)] buffer of register values
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReadRegisters = context.zetDdiTable.Debug.pfnReadRegisters;
        if( nullptr != pfnReadRegisters )
        {
            result = pfnReadRegisters( hDebug, thread, type, start, count, pRegisterValues );
        }
        else
        {
            // generic implementation
        }

        return result;
    }